

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# io_buf.h
# Opt level: O3

ssize_t __thiscall io_buf::fill(io_buf *this,int f)

{
  char **ppcVar1;
  char *pcVar2;
  int iVar3;
  int extraout_var;
  char *pcVar5;
  char *pcVar6;
  ssize_t sVar4;
  
  pcVar6 = (this->space)._end;
  pcVar5 = (this->space).end_array;
  if (pcVar5 == pcVar6) {
    pcVar6 = (this->space)._begin;
    pcVar2 = this->head;
    v_array<char>::resize(&this->space,((long)pcVar5 - (long)pcVar6) * 2);
    this->head = pcVar2 + ((long)(this->space)._begin - (long)pcVar6);
    pcVar6 = (this->space)._end;
    pcVar5 = (this->space).end_array;
  }
  iVar3 = (*this->_vptr_io_buf[5])(this,f,pcVar6,(long)pcVar5 - (long)pcVar6);
  sVar4 = CONCAT44(extraout_var,iVar3);
  if (extraout_var < 0) {
    sVar4 = 0;
  }
  else {
    ppcVar1 = &(this->space)._end;
    *ppcVar1 = *ppcVar1 + sVar4;
  }
  return sVar4;
}

Assistant:

ssize_t fill(int f)
  {  // if the loaded values have reached the allocated space
    if (space.end_array - space.end() == 0)
    {  // reallocate to twice as much space
      size_t head_loc = head - space.begin();
      space.resize(2 * (space.end_array - space.begin()));
      head = space.begin() + head_loc;
    }
    // read more bytes from file up to the remaining allocated space
    ssize_t num_read = read_file(f, space.end(), space.end_array - space.end());
    if (num_read >= 0)
    {  // if some bytes were actually loaded, update the end of loaded values
      space.end() = space.end() + num_read;
      return num_read;
    }
    else
      return 0;
  }